

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j,short *data,stbi__huffman *hac,stbi__int16 *fac)

{
  byte bVar1;
  short sVar2;
  undefined4 uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  ushort *puVar7;
  byte bVar8;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  short *p_1;
  int rs_1;
  int s_1;
  int r_1;
  short *p;
  short bit;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int shift;
  int k;
  ushort *in_stack_ffffffffffffff98;
  int n;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_2c;
  int local_4;
  
  if (*(int *)(in_RDI + 0x4834) == 0) {
    local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  else {
    if (*(int *)(in_RDI + 0x483c) == 0) {
      uVar3 = *(undefined4 *)(in_RDI + 0x4840);
      if (*(int *)(in_RDI + 0x4844) != 0) {
        *(int *)(in_RDI + 0x4844) = *(int *)(in_RDI + 0x4844) + -1;
        return 1;
      }
      local_2c = *(int *)(in_RDI + 0x4834);
      do {
        if (*(int *)(in_RDI + 0x4824) < 0x10) {
          stbi__grow_buffer_unsafe
                    ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        }
        sVar2 = *(short *)(in_RCX + (long)(int)(*(uint *)(in_RDI + 0x4820) >> 0x17) * 2);
        uVar5 = (uint)sVar2;
        bVar8 = (byte)uVar3;
        if (uVar5 == 0) {
          uVar5 = stbi__jpeg_huff_decode
                            ((stbi__jpeg *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (stbi__huffman *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if ((int)uVar5 < 0) {
            iVar6 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
            ;
            return iVar6;
          }
          iVar6 = (int)uVar5 >> 4;
          n = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
          if ((uVar5 & 0xf) == 0) {
            if (iVar6 < 0xf) {
              *(int *)(in_RDI + 0x4844) = 1 << ((byte)iVar6 & 0x1f);
              if (iVar6 != 0) {
                iVar6 = stbi__jpeg_get_bits((stbi__jpeg *)
                                            CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),n);
                *(int *)(in_RDI + 0x4844) = iVar6 + *(int *)(in_RDI + 0x4844);
              }
              *(int *)(in_RDI + 0x4844) = *(int *)(in_RDI + 0x4844) + -1;
              break;
            }
            local_2c = local_2c + 0x10;
          }
          else {
            iVar6 = iVar6 + local_2c;
            local_2c = iVar6 + 1;
            bVar1 = ""[iVar6];
            iVar6 = stbi__extend_receive
                              ((stbi__jpeg *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),n);
            *(short *)(in_RSI + (ulong)bVar1 * 2) = (short)iVar6 * (short)(1 << (bVar8 & 0x1f));
          }
        }
        else {
          iVar6 = ((int)uVar5 >> 4 & 0xfU) + local_2c;
          *(int *)(in_RDI + 0x4820) = *(int *)(in_RDI + 0x4820) << (sbyte)(uVar5 & 0xf);
          *(uint *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - (uVar5 & 0xf);
          local_2c = iVar6 + 1;
          *(short *)(in_RSI + (ulong)""[iVar6] * 2) =
               (short)(char)((ushort)sVar2 >> 8) * (short)(1 << (bVar8 & 0x1f));
        }
      } while (local_2c <= *(int *)(in_RDI + 0x4838));
    }
    else {
      uVar4 = (ushort)(1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
      if (*(int *)(in_RDI + 0x4844) == 0) {
        local_2c = *(int *)(in_RDI + 0x4834);
        do {
          in_stack_ffffffffffffffa4 =
               stbi__jpeg_huff_decode
                         ((stbi__jpeg *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (stbi__huffman *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if ((int)in_stack_ffffffffffffffa4 < 0) {
            iVar6 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
            ;
            return iVar6;
          }
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa4 & 0xf;
          in_stack_ffffffffffffffac = (int)in_stack_ffffffffffffffa4 >> 4;
          if (in_stack_ffffffffffffffa8 == 0) {
            if (in_stack_ffffffffffffffac < 0xf) {
              *(int *)(in_RDI + 0x4844) = (1 << ((byte)in_stack_ffffffffffffffac & 0x1f)) + -1;
              if (in_stack_ffffffffffffffac != 0) {
                iVar6 = stbi__jpeg_get_bits((stbi__jpeg *)
                                            CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),
                                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
                *(int *)(in_RDI + 0x4844) = iVar6 + *(int *)(in_RDI + 0x4844);
              }
              in_stack_ffffffffffffffac = 0x40;
            }
          }
          else {
            if (in_stack_ffffffffffffffa8 != 1) {
              iVar6 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ));
              return iVar6;
            }
            iVar6 = stbi__jpeg_get_bit((stbi__jpeg *)
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                      );
            if (iVar6 == 0) {
              in_stack_ffffffffffffffa8 = -(int)(short)uVar4;
            }
            else {
              in_stack_ffffffffffffffa8 = (uint)(short)uVar4;
            }
          }
          while (local_2c <= *(int *)(in_RDI + 0x4838)) {
            iVar6 = local_2c + 1;
            in_stack_ffffffffffffff98 = (ushort *)(in_RSI + (ulong)""[local_2c] * 2);
            local_2c = iVar6;
            if (*in_stack_ffffffffffffff98 == 0) {
              if (in_stack_ffffffffffffffac == 0) {
                *in_stack_ffffffffffffff98 = (ushort)in_stack_ffffffffffffffa8;
                break;
              }
              in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + -1;
            }
            else {
              iVar6 = stbi__jpeg_get_bit((stbi__jpeg *)
                                         CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
              if ((iVar6 != 0) && ((*in_stack_ffffffffffffff98 & uVar4) == 0)) {
                if ((short)*in_stack_ffffffffffffff98 < 1) {
                  *in_stack_ffffffffffffff98 = *in_stack_ffffffffffffff98 - uVar4;
                }
                else {
                  *in_stack_ffffffffffffff98 = *in_stack_ffffffffffffff98 + uVar4;
                }
              }
            }
          }
        } while (local_2c <= *(int *)(in_RDI + 0x4838));
      }
      else {
        *(int *)(in_RDI + 0x4844) = *(int *)(in_RDI + 0x4844) + -1;
        for (local_2c = *(int *)(in_RDI + 0x4834); local_2c <= *(int *)(in_RDI + 0x4838);
            local_2c = local_2c + 1) {
          puVar7 = (ushort *)(in_RSI + (ulong)""[local_2c] * 2);
          if (((*puVar7 != 0) &&
              (iVar6 = stbi__jpeg_get_bit((stbi__jpeg *)
                                          CONCAT44(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0)), iVar6 != 0)) &&
             ((*puVar7 & uVar4) == 0)) {
            if ((short)*puVar7 < 1) {
              *puVar7 = *puVar7 - uVar4;
            }
            else {
              *puVar7 = *puVar7 + uVar4;
            }
          }
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j, short data[64], stbi__huffman *hac, stbi__int16 *fac)
{
   int k;
   if (j->spec_start == 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->succ_high == 0) {
      int shift = j->succ_low;

      if (j->eob_run) {
         --j->eob_run;
         return 1;
      }

      k = j->spec_start;
      do {
         unsigned int zig;
         int c,r,s;
         if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
         c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
         r = fac[c];
         if (r) { // fast-AC path
            k += (r >> 4) & 15; // run
            s = r & 15; // combined length
            j->code_buffer <<= s;
            j->code_bits -= s;
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) ((r >> 8) * (1 << shift));
         } else {
            int rs = stbi__jpeg_huff_decode(j, hac);
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r);
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  --j->eob_run;
                  break;
               }
               k += 16;
            } else {
               k += r;
               zig = stbi__jpeg_dezigzag[k++];
               data[zig] = (short) (stbi__extend_receive(j,s) * (1 << shift));
            }
         }
      } while (k <= j->spec_end);
   } else {
      // refinement scan for these AC coefficients

      short bit = (short) (1 << j->succ_low);

      if (j->eob_run) {
         --j->eob_run;
         for (k = j->spec_start; k <= j->spec_end; ++k) {
            short *p = &data[stbi__jpeg_dezigzag[k]];
            if (*p != 0)
               if (stbi__jpeg_get_bit(j))
                  if ((*p & bit)==0) {
                     if (*p > 0)
                        *p += bit;
                     else
                        *p -= bit;
                  }
         }
      } else {
         k = j->spec_start;
         do {
            int r,s;
            int rs = stbi__jpeg_huff_decode(j, hac); // @OPTIMIZE see if we can use the fast path here, advance-by-r is so slow, eh
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r) - 1;
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  r = 64; // force end of block
               } else {
                  // r=15 s=0 should write 16 0s, so we just do
                  // a run of 15 0s and then write s (which is 0),
                  // so we don't have to do anything special here
               }
            } else {
               if (s != 1) return stbi__err("bad huffman code", "Corrupt JPEG");
               // sign bit
               if (stbi__jpeg_get_bit(j))
                  s = bit;
               else
                  s = -bit;
            }

            // advance by r
            while (k <= j->spec_end) {
               short *p = &data[stbi__jpeg_dezigzag[k++]];
               if (*p != 0) {
                  if (stbi__jpeg_get_bit(j))
                     if ((*p & bit)==0) {
                        if (*p > 0)
                           *p += bit;
                        else
                           *p -= bit;
                     }
               } else {
                  if (r == 0) {
                     *p = (short) s;
                     break;
                  }
                  --r;
               }
            }
         } while (k <= j->spec_end);
      }
   }
   return 1;
}